

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong uVar10;
  int iVar11;
  undefined4 uVar12;
  long lVar13;
  Scene *pSVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar45;
  float fVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar57 [16];
  uint uVar56;
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar60 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2760 [16];
  Scene *local_2748;
  Geometry *local_2740;
  ulong local_2738;
  ulong local_2730;
  ulong local_2728;
  undefined1 (*local_2720) [16];
  long local_2718;
  ulong local_2710;
  ulong local_2708;
  RTCFilterFunctionNArguments local_2700;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2670 [16];
  float local_2660 [4];
  float local_2650 [4];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined1 local_25e0 [16];
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar39 [32];
  undefined1 auVar44 [32];
  
  local_2720 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar78 = ZEXT3264(CONCAT428(fVar40,CONCAT424(fVar40,CONCAT420(fVar40,CONCAT416(fVar40,CONCAT412(
                                                  fVar40,CONCAT48(fVar40,CONCAT44(fVar40,fVar40)))))
                                               )));
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_24e0._4_4_ = fVar45;
  local_24e0._0_4_ = fVar45;
  local_24e0._8_4_ = fVar45;
  local_24e0._12_4_ = fVar45;
  local_24e0._16_4_ = fVar45;
  local_24e0._20_4_ = fVar45;
  local_24e0._24_4_ = fVar45;
  local_24e0._28_4_ = fVar45;
  auVar51 = ZEXT3264(local_24e0);
  fVar46 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_2500._4_4_ = fVar46;
  local_2500._0_4_ = fVar46;
  local_2500._8_4_ = fVar46;
  local_2500._12_4_ = fVar46;
  local_2500._16_4_ = fVar46;
  local_2500._20_4_ = fVar46;
  local_2500._24_4_ = fVar46;
  local_2500._28_4_ = fVar46;
  auVar53 = ZEXT3264(local_2500);
  fVar40 = fVar40 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar46 = fVar46 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar24 = uVar21 ^ 0x20;
  local_2708 = uVar19 ^ 0x20;
  local_2710 = uVar15 ^ 0x20;
  iVar11 = (tray->tfar).field_0.i[k];
  auVar29 = ZEXT3264(CONCAT428(iVar11,CONCAT424(iVar11,CONCAT420(iVar11,CONCAT416(iVar11,CONCAT412(
                                                  iVar11,CONCAT48(iVar11,CONCAT44(iVar11,iVar11)))))
                                               )));
  local_2520._0_8_ = CONCAT44(fVar40,fVar40) ^ 0x8000000080000000;
  local_2520._8_4_ = -fVar40;
  local_2520._12_4_ = -fVar40;
  local_2520._16_4_ = -fVar40;
  local_2520._20_4_ = -fVar40;
  local_2520._24_4_ = -fVar40;
  local_2520._28_4_ = -fVar40;
  auVar55 = ZEXT3264(local_2520);
  local_2540._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  local_2540._8_4_ = -fVar45;
  local_2540._12_4_ = -fVar45;
  local_2540._16_4_ = -fVar45;
  local_2540._20_4_ = -fVar45;
  local_2540._24_4_ = -fVar45;
  local_2540._28_4_ = -fVar45;
  auVar60 = ZEXT3264(local_2540);
  local_2560._0_8_ = CONCAT44(fVar46,fVar46) ^ 0x8000000080000000;
  local_2560._8_4_ = -fVar46;
  local_2560._12_4_ = -fVar46;
  local_2560._16_4_ = -fVar46;
  local_2560._20_4_ = -fVar46;
  local_2560._24_4_ = -fVar46;
  local_2560._28_4_ = -fVar46;
  auVar66 = ZEXT3264(local_2560);
  iVar11 = (tray->tnear).field_0.i[k];
  local_2580._4_4_ = iVar11;
  local_2580._0_4_ = iVar11;
  local_2580._8_4_ = iVar11;
  local_2580._12_4_ = iVar11;
  local_2580._16_4_ = iVar11;
  local_2580._20_4_ = iVar11;
  local_2580._24_4_ = iVar11;
  local_2580._28_4_ = iVar11;
  auVar69 = ZEXT3264(local_2580);
  iVar11 = 1 << ((uint)k & 0x1f);
  auVar28._4_4_ = iVar11;
  auVar28._0_4_ = iVar11;
  auVar28._8_4_ = iVar11;
  auVar28._12_4_ = iVar11;
  auVar28._16_4_ = iVar11;
  auVar28._20_4_ = iVar11;
  auVar28._24_4_ = iVar11;
  auVar28._28_4_ = iVar11;
  auVar39 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar28 = vpand_avx2(auVar28,auVar39);
  local_25a0 = vpcmpeqd_avx2(auVar28,auVar39);
  do {
    do {
      do {
        if (local_2720 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar20 = local_2720 + -1;
        local_2720 = local_2720 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar20 + 8));
      uVar23 = *(ulong *)*local_2720;
      do {
        auVar65 = auVar66._0_32_;
        auVar59 = auVar60._0_32_;
        auVar44 = auVar55._0_32_;
        auVar39 = auVar53._0_32_;
        auVar28 = auVar51._0_32_;
        if ((uVar23 & 8) == 0) {
          auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar21),auVar44,
                                    auVar78._0_32_);
          auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar19),auVar59,auVar28);
          auVar8 = vpmaxsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar36));
          auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar15),auVar65,auVar39);
          auVar9 = vpmaxsd_avx2(ZEXT1632(auVar30),auVar69._0_32_);
          local_24c0 = vpmaxsd_avx2(auVar8,auVar9);
          auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar24),auVar44,
                                    auVar78._0_32_);
          auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + local_2708),auVar59,
                                    auVar28);
          auVar8 = vpminsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar36));
          auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + local_2710),auVar65,
                                    auVar39);
          auVar9 = vpminsd_avx2(ZEXT1632(auVar30),auVar29._0_32_);
          auVar8 = vpminsd_avx2(auVar8,auVar9);
          auVar8 = vpcmpgtd_avx2(local_24c0,auVar8);
          uVar12 = vmovmskps_avx(auVar8);
          unaff_R15 = (ulong)(byte)~(byte)uVar12;
        }
        if ((uVar23 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar11 = 4;
          }
          else {
            uVar22 = uVar23 & 0xfffffffffffffff0;
            lVar25 = 0;
            for (uVar23 = unaff_R15; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            iVar11 = 0;
            uVar17 = unaff_R15 - 1 & unaff_R15;
            uVar23 = *(ulong *)(uVar22 + lVar25 * 8);
            if (uVar17 != 0) {
              uVar56 = *(uint *)(local_24c0 + lVar25 * 4);
              lVar25 = 0;
              for (uVar10 = uVar17; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                lVar25 = lVar25 + 1;
              }
              uVar17 = uVar17 - 1 & uVar17;
              uVar10 = *(ulong *)(uVar22 + lVar25 * 8);
              uVar61 = *(uint *)(local_24c0 + lVar25 * 4);
              if (uVar17 == 0) {
                if (uVar56 < uVar61) {
                  *(ulong *)*local_2720 = uVar10;
                  *(uint *)(*local_2720 + 8) = uVar61;
                  local_2720 = local_2720 + 1;
                }
                else {
                  *(ulong *)*local_2720 = uVar23;
                  *(uint *)(*local_2720 + 8) = uVar56;
                  local_2720 = local_2720 + 1;
                  uVar23 = uVar10;
                }
              }
              else {
                auVar30._8_8_ = 0;
                auVar30._0_8_ = uVar23;
                auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar56));
                auVar36._8_8_ = 0;
                auVar36._0_8_ = uVar10;
                auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar61));
                lVar25 = 0;
                for (uVar23 = uVar17; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000)
                {
                  lVar25 = lVar25 + 1;
                }
                uVar17 = uVar17 - 1 & uVar17;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = *(ulong *)(uVar22 + lVar25 * 8);
                auVar31 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_24c0 + lVar25 * 4)));
                auVar41 = vpcmpgtd_avx(auVar36,auVar30);
                if (uVar17 == 0) {
                  auVar48 = vpshufd_avx(auVar41,0xaa);
                  auVar41 = vblendvps_avx(auVar36,auVar30,auVar48);
                  auVar30 = vblendvps_avx(auVar30,auVar36,auVar48);
                  auVar36 = vpcmpgtd_avx(auVar31,auVar41);
                  auVar48 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar31,auVar41,auVar48);
                  auVar41 = vblendvps_avx(auVar41,auVar31,auVar48);
                  auVar31 = vpcmpgtd_avx(auVar41,auVar30);
                  auVar48 = vpshufd_avx(auVar31,0xaa);
                  auVar31 = vblendvps_avx(auVar41,auVar30,auVar48);
                  auVar30 = vblendvps_avx(auVar30,auVar41,auVar48);
                  *local_2720 = auVar30;
                  local_2720[1] = auVar31;
                  uVar23 = auVar36._0_8_;
                  local_2720 = local_2720 + 2;
                }
                else {
                  lVar25 = 0;
                  for (uVar23 = uVar17; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000
                      ) {
                    lVar25 = lVar25 + 1;
                  }
                  uVar17 = uVar17 - 1 & uVar17;
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = *(ulong *)(uVar22 + lVar25 * 8);
                  auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_24c0 + lVar25 * 4)));
                  if (uVar17 == 0) {
                    auVar42 = vpshufd_avx(auVar41,0xaa);
                    auVar41 = vblendvps_avx(auVar36,auVar30,auVar42);
                    auVar30 = vblendvps_avx(auVar30,auVar36,auVar42);
                    auVar36 = vpcmpgtd_avx(auVar48,auVar31);
                    auVar42 = vpshufd_avx(auVar36,0xaa);
                    auVar36 = vblendvps_avx(auVar48,auVar31,auVar42);
                    auVar31 = vblendvps_avx(auVar31,auVar48,auVar42);
                    auVar48 = vpcmpgtd_avx(auVar31,auVar30);
                    auVar42 = vpshufd_avx(auVar48,0xaa);
                    auVar48 = vblendvps_avx(auVar31,auVar30,auVar42);
                    auVar30 = vblendvps_avx(auVar30,auVar31,auVar42);
                    auVar31 = vpcmpgtd_avx(auVar36,auVar41);
                    auVar42 = vpshufd_avx(auVar31,0xaa);
                    auVar31 = vblendvps_avx(auVar36,auVar41,auVar42);
                    auVar36 = vblendvps_avx(auVar41,auVar36,auVar42);
                    auVar41 = vpcmpgtd_avx(auVar48,auVar36);
                    auVar42 = vpshufd_avx(auVar41,0xaa);
                    auVar41 = vblendvps_avx(auVar48,auVar36,auVar42);
                    auVar36 = vblendvps_avx(auVar36,auVar48,auVar42);
                    *local_2720 = auVar30;
                    local_2720[1] = auVar36;
                    local_2720[2] = auVar41;
                    uVar23 = auVar31._0_8_;
                    pauVar20 = local_2720 + 3;
                  }
                  else {
                    *local_2720 = auVar30;
                    local_2720[1] = auVar36;
                    local_2720[2] = auVar31;
                    local_2720[3] = auVar48;
                    lVar25 = 0x30;
                    do {
                      lVar13 = lVar25;
                      lVar25 = 0;
                      for (uVar23 = uVar17; (uVar23 & 1) == 0;
                          uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      auVar31._8_8_ = 0;
                      auVar31._0_8_ = *(ulong *)(uVar22 + lVar25 * 8);
                      auVar30 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_24c0 + lVar25 * 4)))
                      ;
                      *(undefined1 (*) [16])(local_2720[1] + lVar13) = auVar30;
                      uVar17 = uVar17 - 1 & uVar17;
                      lVar25 = lVar13 + 0x10;
                    } while (uVar17 != 0);
                    pauVar20 = (undefined1 (*) [16])(local_2720[1] + lVar13);
                    if (lVar13 + 0x10 != 0) {
                      lVar25 = 0x10;
                      pauVar16 = local_2720;
                      do {
                        auVar30 = pauVar16[1];
                        uVar56 = *(uint *)(pauVar16[1] + 8);
                        pauVar16 = pauVar16 + 1;
                        lVar13 = lVar25;
                        do {
                          if (uVar56 <= *(uint *)(local_2720[-1] + lVar13 + 8)) {
                            pauVar18 = (undefined1 (*) [16])(*local_2720 + lVar13);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_2720 + lVar13) =
                               *(undefined1 (*) [16])(local_2720[-1] + lVar13);
                          lVar13 = lVar13 + -0x10;
                          pauVar18 = local_2720;
                        } while (lVar13 != 0);
                        *pauVar18 = auVar30;
                        lVar25 = lVar25 + 0x10;
                      } while (pauVar20 != pauVar16);
                    }
                    uVar23 = *(ulong *)*pauVar20;
                  }
                  auVar51 = ZEXT3264(auVar28);
                  auVar53 = ZEXT3264(auVar39);
                  auVar55 = ZEXT3264(auVar44);
                  auVar60 = ZEXT3264(auVar59);
                  auVar66 = ZEXT3264(auVar65);
                  auVar69 = ZEXT3264(auVar69._0_32_);
                  local_2720 = pauVar20;
                  iVar11 = 0;
                }
              }
            }
          }
        }
        else {
          iVar11 = 6;
        }
      } while (iVar11 == 0);
    } while (iVar11 != 6);
    local_2718 = (ulong)((uint)uVar23 & 0xf) - 8;
    if (local_2718 != 0) {
      uVar23 = uVar23 & 0xfffffffffffffff0;
      lVar25 = 0;
      do {
        lVar13 = lVar25 * 0x50;
        pSVar14 = context->scene;
        ppfVar2 = (pSVar14->vertices).items;
        pfVar3 = ppfVar2[*(uint *)(uVar23 + 0x30 + lVar13)];
        pfVar4 = ppfVar2[*(uint *)(uVar23 + 0x34 + lVar13)];
        pfVar5 = ppfVar2[*(uint *)(uVar23 + 0x38 + lVar13)];
        pfVar6 = ppfVar2[*(uint *)(uVar23 + 0x3c + lVar13)];
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar23 + lVar13)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar23 + 8 + lVar13)));
        auVar30 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar23 + lVar13)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar23 + 8 + lVar13)));
        auVar31 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar23 + 4 + lVar13)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar23 + 0xc + lVar13)));
        auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar23 + 4 + lVar13)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar23 + 0xc + lVar13)));
        auVar33 = vunpcklps_avx(auVar30,auVar36);
        auVar37 = vunpcklps_avx(auVar41,auVar31);
        auVar50 = vunpckhps_avx(auVar41,auVar31);
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar23 + 0x10 + lVar13)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar23 + 0x18 + lVar13)));
        auVar30 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar23 + 0x10 + lVar13)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar23 + 0x18 + lVar13)));
        auVar31 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar23 + 0x14 + lVar13)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar23 + 0x1c + lVar13)));
        auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar23 + 0x14 + lVar13)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar23 + 0x1c + lVar13)));
        auVar42 = vunpcklps_avx(auVar30,auVar36);
        auVar26 = vunpcklps_avx(auVar41,auVar31);
        auVar30 = vunpckhps_avx(auVar41,auVar31);
        auVar31 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar23 + 0x20 + lVar13)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar23 + 0x28 + lVar13)));
        auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar23 + 0x20 + lVar13)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar23 + 0x28 + lVar13)));
        auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar23 + 0x24 + lVar13)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar23 + 0x2c + lVar13)));
        auVar41 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar23 + 0x24 + lVar13)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar23 + 0x2c + lVar13)));
        auVar32 = vunpcklps_avx(auVar36,auVar41);
        auVar52 = vunpcklps_avx(auVar31,auVar48);
        auVar48 = vunpckhps_avx(auVar31,auVar48);
        puVar1 = (undefined8 *)(uVar23 + 0x30 + lVar13);
        local_25d0 = *puVar1;
        uStack_25c8 = puVar1[1];
        puVar1 = (undefined8 *)(uVar23 + 0x40 + lVar13);
        local_26d0 = *puVar1;
        uStack_26c8 = puVar1[1];
        auVar36 = vsubps_avx(auVar37,auVar26);
        auVar30 = vsubps_avx(auVar50,auVar30);
        auVar41 = vsubps_avx(auVar33,auVar42);
        auVar31 = vsubps_avx(auVar52,auVar37);
        auVar48 = vsubps_avx(auVar48,auVar50);
        auVar42 = vsubps_avx(auVar32,auVar33);
        auVar26._0_4_ = auVar42._0_4_ * auVar30._0_4_;
        auVar26._4_4_ = auVar42._4_4_ * auVar30._4_4_;
        auVar26._8_4_ = auVar42._8_4_ * auVar30._8_4_;
        auVar26._12_4_ = auVar42._12_4_ * auVar30._12_4_;
        local_2630 = vfmsub231ps_fma(auVar26,auVar48,auVar41);
        auVar32._0_4_ = auVar41._0_4_ * auVar31._0_4_;
        auVar32._4_4_ = auVar41._4_4_ * auVar31._4_4_;
        auVar32._8_4_ = auVar41._8_4_ * auVar31._8_4_;
        auVar32._12_4_ = auVar41._12_4_ * auVar31._12_4_;
        local_2620 = vfmsub231ps_fma(auVar32,auVar42,auVar36);
        uVar12 = *(undefined4 *)(ray + k * 4);
        auVar70._4_4_ = uVar12;
        auVar70._0_4_ = uVar12;
        auVar70._8_4_ = uVar12;
        auVar70._12_4_ = uVar12;
        uVar12 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar72._4_4_ = uVar12;
        auVar72._0_4_ = uVar12;
        auVar72._8_4_ = uVar12;
        auVar72._12_4_ = uVar12;
        uVar12 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar75._4_4_ = uVar12;
        auVar75._0_4_ = uVar12;
        auVar75._8_4_ = uVar12;
        auVar75._12_4_ = uVar12;
        fVar40 = *(float *)(ray + k * 4 + 0x80);
        auVar64._4_4_ = fVar40;
        auVar64._0_4_ = fVar40;
        auVar64._8_4_ = fVar40;
        auVar64._12_4_ = fVar40;
        auVar37 = vsubps_avx(auVar37,auVar70);
        fVar45 = *(float *)(ray + k * 4 + 0xa0);
        auVar71._4_4_ = fVar45;
        auVar71._0_4_ = fVar45;
        auVar71._8_4_ = fVar45;
        auVar71._12_4_ = fVar45;
        auVar50 = vsubps_avx(auVar50,auVar72);
        fVar46 = *(float *)(ray + k * 4 + 0xc0);
        auVar73._4_4_ = fVar46;
        auVar73._0_4_ = fVar46;
        auVar73._8_4_ = fVar46;
        auVar73._12_4_ = fVar46;
        auVar33 = vsubps_avx(auVar33,auVar75);
        auVar76._0_4_ = fVar40 * auVar50._0_4_;
        auVar76._4_4_ = fVar40 * auVar50._4_4_;
        auVar76._8_4_ = fVar40 * auVar50._8_4_;
        auVar76._12_4_ = fVar40 * auVar50._12_4_;
        auVar26 = vfmsub231ps_fma(auVar76,auVar37,auVar71);
        auVar67._0_4_ = auVar42._0_4_ * auVar26._0_4_;
        auVar67._4_4_ = auVar42._4_4_ * auVar26._4_4_;
        auVar67._8_4_ = auVar42._8_4_ * auVar26._8_4_;
        auVar67._12_4_ = auVar42._12_4_ * auVar26._12_4_;
        auVar77._0_4_ = auVar41._0_4_ * auVar26._0_4_;
        auVar77._4_4_ = auVar41._4_4_ * auVar26._4_4_;
        auVar77._8_4_ = auVar41._8_4_ * auVar26._8_4_;
        auVar77._12_4_ = auVar41._12_4_ * auVar26._12_4_;
        auVar57._0_4_ = fVar46 * auVar37._0_4_;
        auVar57._4_4_ = fVar46 * auVar37._4_4_;
        auVar57._8_4_ = fVar46 * auVar37._8_4_;
        auVar57._12_4_ = fVar46 * auVar37._12_4_;
        auVar42 = vfmsub231ps_fma(auVar57,auVar33,auVar64);
        auVar41 = vfmadd231ps_fma(auVar67,auVar42,auVar48);
        auVar42 = vfmadd231ps_fma(auVar77,auVar30,auVar42);
        auVar54._0_4_ = auVar48._0_4_ * auVar36._0_4_;
        auVar54._4_4_ = auVar48._4_4_ * auVar36._4_4_;
        auVar54._8_4_ = auVar48._8_4_ * auVar36._8_4_;
        auVar54._12_4_ = auVar48._12_4_ * auVar36._12_4_;
        local_2610 = vfmsub231ps_fma(auVar54,auVar31,auVar30);
        auVar52._0_4_ = fVar45 * auVar33._0_4_;
        auVar52._4_4_ = fVar45 * auVar33._4_4_;
        auVar52._8_4_ = fVar45 * auVar33._8_4_;
        auVar52._12_4_ = fVar45 * auVar33._12_4_;
        auVar26 = vfmsub231ps_fma(auVar52,auVar50,auVar73);
        auVar74._0_4_ = local_2610._0_4_ * fVar46;
        auVar74._4_4_ = local_2610._4_4_ * fVar46;
        auVar74._8_4_ = local_2610._8_4_ * fVar46;
        auVar74._12_4_ = local_2610._12_4_ * fVar46;
        auVar30 = vfmadd231ps_fma(auVar74,local_2620,auVar71);
        auVar48 = vfmadd231ps_fma(auVar30,local_2630,auVar64);
        auVar58._8_4_ = 0x80000000;
        auVar58._0_8_ = 0x8000000080000000;
        auVar58._12_4_ = 0x80000000;
        auVar41 = vfmadd231ps_fma(auVar41,auVar26,auVar31);
        auVar30 = vandps_avx(auVar48,auVar58);
        uVar56 = auVar30._0_4_;
        local_26c0._0_4_ = (float)(uVar56 ^ auVar41._0_4_);
        uVar61 = auVar30._4_4_;
        local_26c0._4_4_ = (float)(uVar61 ^ auVar41._4_4_);
        uVar62 = auVar30._8_4_;
        local_26c0._8_4_ = (float)(uVar62 ^ auVar41._8_4_);
        uVar63 = auVar30._12_4_;
        local_26c0._12_4_ = (float)(uVar63 ^ auVar41._12_4_);
        auVar30 = vfmadd231ps_fma(auVar42,auVar36,auVar26);
        local_26b0._0_4_ = (float)(uVar56 ^ auVar30._0_4_);
        local_26b0._4_4_ = (float)(uVar61 ^ auVar30._4_4_);
        local_26b0._8_4_ = (float)(uVar62 ^ auVar30._8_4_);
        local_26b0._12_4_ = (float)(uVar63 ^ auVar30._12_4_);
        auVar41 = ZEXT816(0) << 0x20;
        auVar30 = vcmpps_avx(local_26c0,auVar41,5);
        auVar36 = vcmpps_avx(local_26b0,auVar41,5);
        auVar30 = vandps_avx(auVar36,auVar30);
        auVar42._8_4_ = 0x7fffffff;
        auVar42._0_8_ = 0x7fffffff7fffffff;
        auVar42._12_4_ = 0x7fffffff;
        local_2690 = vandps_avx(auVar48,auVar42);
        auVar36 = vcmpps_avx(auVar48,auVar41,4);
        auVar30 = vandps_avx(auVar30,auVar36);
        auVar68._0_4_ = local_26c0._0_4_ + local_26b0._0_4_;
        auVar68._4_4_ = local_26c0._4_4_ + local_26b0._4_4_;
        auVar68._8_4_ = local_26c0._8_4_ + local_26b0._8_4_;
        auVar68._12_4_ = local_26c0._12_4_ + local_26b0._12_4_;
        auVar36 = vcmpps_avx(auVar68,local_2690,2);
        auVar41 = auVar36 & auVar30;
        if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar41[0xf] < '\0') {
          auVar30 = vandps_avx(auVar30,auVar36);
          auVar49._0_4_ = local_2610._0_4_ * auVar33._0_4_;
          auVar49._4_4_ = local_2610._4_4_ * auVar33._4_4_;
          auVar49._8_4_ = local_2610._8_4_ * auVar33._8_4_;
          auVar49._12_4_ = local_2610._12_4_ * auVar33._12_4_;
          auVar36 = vfmadd213ps_fma(auVar50,local_2620,auVar49);
          auVar36 = vfmadd213ps_fma(auVar37,local_2630,auVar36);
          local_26a0._0_4_ = (float)(uVar56 ^ auVar36._0_4_);
          local_26a0._4_4_ = (float)(uVar61 ^ auVar36._4_4_);
          local_26a0._8_4_ = (float)(uVar62 ^ auVar36._8_4_);
          local_26a0._12_4_ = (float)(uVar63 ^ auVar36._12_4_);
          fVar40 = *(float *)(ray + k * 4 + 0x60);
          auVar37._0_4_ = local_2690._0_4_ * fVar40;
          auVar37._4_4_ = local_2690._4_4_ * fVar40;
          auVar37._8_4_ = local_2690._8_4_ * fVar40;
          auVar37._12_4_ = local_2690._12_4_ * fVar40;
          auVar36 = vcmpps_avx(auVar37,local_26a0,1);
          fVar40 = *(float *)(ray + k * 4 + 0x100);
          auVar50._0_4_ = local_2690._0_4_ * fVar40;
          auVar50._4_4_ = local_2690._4_4_ * fVar40;
          auVar50._8_4_ = local_2690._8_4_ * fVar40;
          auVar50._12_4_ = local_2690._12_4_ * fVar40;
          auVar41 = vcmpps_avx(local_26a0,auVar50,2);
          auVar36 = vandps_avx(auVar36,auVar41);
          auVar41 = auVar30 & auVar36;
          if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar41[0xf] < '\0') {
            local_2760 = vandps_avx(auVar30,auVar36);
            local_2670 = local_2760;
            auVar30 = vrcpps_avx(local_2690);
            auVar33._8_4_ = 0x3f800000;
            auVar33._0_8_ = &DAT_3f8000003f800000;
            auVar33._12_4_ = 0x3f800000;
            auVar36 = vfnmadd213ps_fma(local_2690,auVar30,auVar33);
            auVar30 = vfmadd132ps_fma(auVar36,auVar30,auVar30);
            fVar40 = auVar30._0_4_;
            local_2640._0_4_ = fVar40 * local_26a0._0_4_;
            fVar45 = auVar30._4_4_;
            local_2640._4_4_ = fVar45 * local_26a0._4_4_;
            fVar46 = auVar30._8_4_;
            local_2640._8_4_ = fVar46 * local_26a0._8_4_;
            fVar47 = auVar30._12_4_;
            local_2640._12_4_ = fVar47 * local_26a0._12_4_;
            auVar29 = ZEXT1664(local_2640);
            local_2660[0] = fVar40 * local_26c0._0_4_;
            local_2660[1] = fVar45 * local_26c0._4_4_;
            local_2660[2] = fVar46 * local_26c0._8_4_;
            local_2660[3] = fVar47 * local_26c0._12_4_;
            auVar34._8_4_ = 0x7f800000;
            auVar34._0_8_ = 0x7f8000007f800000;
            auVar34._12_4_ = 0x7f800000;
            auVar30 = vblendvps_avx(auVar34,local_2640,local_2760);
            local_2650[0] = fVar40 * local_26b0._0_4_;
            local_2650[1] = fVar45 * local_26b0._4_4_;
            local_2650[2] = fVar46 * local_26b0._8_4_;
            local_2650[3] = fVar47 * local_26b0._12_4_;
            auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
            auVar36 = vminps_avx(auVar36,auVar30);
            auVar41 = vshufpd_avx(auVar36,auVar36,1);
            auVar36 = vminps_avx(auVar41,auVar36);
            auVar36 = vcmpps_avx(auVar30,auVar36,0);
            auVar41 = local_2760 & auVar36;
            auVar30 = vpcmpeqd_avx(auVar30,auVar30);
            if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar41[0xf] < '\0') {
              auVar30 = auVar36;
            }
            auVar30 = vandps_avx(local_2760,auVar30);
            uVar12 = vmovmskps_avx(auVar30);
            local_2738 = 0;
            for (uVar22 = CONCAT44((int)((ulong)lVar13 >> 0x20),uVar12); local_2748 = pSVar14,
                (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              local_2738 = local_2738 + 1;
            }
            do {
              uVar56 = *(uint *)((long)&local_25d0 + local_2738 * 4);
              uVar22 = (ulong)uVar56;
              local_2740 = (pSVar14->geometries).items[uVar22].ptr;
              if ((local_2740->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_2760 + local_2738 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_2740->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar40 = local_2660[local_2738];
                  fVar45 = local_2650[local_2738];
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)(local_2640 + local_2738 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) =
                       *(undefined4 *)(local_2630 + local_2738 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) =
                       *(undefined4 *)(local_2620 + local_2738 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) =
                       *(undefined4 *)(local_2610 + local_2738 * 4);
                  *(float *)(ray + k * 4 + 0x1e0) = fVar40;
                  *(float *)(ray + k * 4 + 0x200) = fVar45;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_26d0 + local_2738 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar56;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_25e0 = auVar29._0_16_;
                local_25c0 = auVar78._0_32_;
                fVar40 = local_2660[local_2738];
                local_2460._4_4_ = fVar40;
                local_2460._0_4_ = fVar40;
                local_2460._8_4_ = fVar40;
                local_2460._12_4_ = fVar40;
                local_2460._16_4_ = fVar40;
                local_2460._20_4_ = fVar40;
                local_2460._24_4_ = fVar40;
                local_2460._28_4_ = fVar40;
                local_2440 = local_2650[local_2738];
                uVar12 = *(undefined4 *)((long)&local_26d0 + local_2738 * 4);
                auVar43._4_4_ = uVar12;
                auVar43._0_4_ = uVar12;
                auVar43._8_4_ = uVar12;
                auVar43._12_4_ = uVar12;
                auVar44._16_4_ = uVar12;
                auVar44._0_16_ = auVar43;
                auVar44._20_4_ = uVar12;
                auVar44._24_4_ = uVar12;
                auVar44._28_4_ = uVar12;
                local_24c0._4_4_ = *(undefined4 *)(local_2630 + local_2738 * 4);
                uVar12 = *(undefined4 *)(local_2620 + local_2738 * 4);
                local_24a0._4_4_ = uVar12;
                local_24a0._0_4_ = uVar12;
                local_24a0._8_4_ = uVar12;
                local_24a0._12_4_ = uVar12;
                local_24a0._16_4_ = uVar12;
                local_24a0._20_4_ = uVar12;
                local_24a0._24_4_ = uVar12;
                local_24a0._28_4_ = uVar12;
                uVar12 = *(undefined4 *)(local_2610 + local_2738 * 4);
                local_2480._4_4_ = uVar12;
                local_2480._0_4_ = uVar12;
                local_2480._8_4_ = uVar12;
                local_2480._12_4_ = uVar12;
                local_2480._16_4_ = uVar12;
                local_2480._20_4_ = uVar12;
                local_2480._24_4_ = uVar12;
                local_2480._28_4_ = uVar12;
                auVar38._4_4_ = uVar56;
                auVar38._0_4_ = uVar56;
                auVar38._8_4_ = uVar56;
                auVar38._12_4_ = uVar56;
                auVar39._16_4_ = uVar56;
                auVar39._0_16_ = auVar38;
                auVar39._20_4_ = uVar56;
                auVar39._24_4_ = uVar56;
                auVar39._28_4_ = uVar56;
                local_24c0._0_4_ = local_24c0._4_4_;
                local_24c0._8_4_ = local_24c0._4_4_;
                local_24c0._12_4_ = local_24c0._4_4_;
                local_24c0._16_4_ = local_24c0._4_4_;
                local_24c0._20_4_ = local_24c0._4_4_;
                local_24c0._24_4_ = local_24c0._4_4_;
                local_24c0._28_4_ = local_24c0._4_4_;
                fStack_243c = local_2440;
                fStack_2438 = local_2440;
                fStack_2434 = local_2440;
                fStack_2430 = local_2440;
                fStack_242c = local_2440;
                fStack_2428 = local_2440;
                fStack_2424 = local_2440;
                local_2420 = auVar44;
                local_2400 = auVar39;
                vpcmpeqd_avx2(local_2460,local_2460);
                uStack_23dc = context->user->instID[0];
                local_23e0 = uStack_23dc;
                uStack_23d8 = uStack_23dc;
                uStack_23d4 = uStack_23dc;
                uStack_23d0 = uStack_23dc;
                uStack_23cc = uStack_23dc;
                uStack_23c8 = uStack_23dc;
                uStack_23c4 = uStack_23dc;
                uStack_23bc = context->user->instPrimID[0];
                local_23c0 = uStack_23bc;
                uStack_23b8 = uStack_23bc;
                uStack_23b4 = uStack_23bc;
                uStack_23b0 = uStack_23bc;
                uStack_23ac = uStack_23bc;
                uStack_23a8 = uStack_23bc;
                uStack_23a4 = uStack_23bc;
                uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2640 + local_2738 * 4);
                local_2600 = local_25a0._0_8_;
                uStack_25f8 = local_25a0._8_8_;
                uStack_25f0 = local_25a0._16_8_;
                uStack_25e8 = local_25a0._24_8_;
                local_2700.valid = (int *)&local_2600;
                local_2700.geometryUserPtr = local_2740->userPtr;
                local_2700.context = context->user;
                local_2700.hit = (RTCHitN *)local_24c0;
                local_2700.N = 8;
                local_2730 = uVar19;
                local_2728 = uVar21;
                local_2700.ray = (RTCRayN *)ray;
                if (local_2740->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar39 = ZEXT1632(auVar38);
                  auVar44 = ZEXT1632(auVar43);
                  (*local_2740->intersectionFilterN)(&local_2700);
                }
                auVar59._8_8_ = uStack_25f8;
                auVar59._0_8_ = local_2600;
                auVar59._16_8_ = uStack_25f0;
                auVar59._24_8_ = uStack_25e8;
                auVar59 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar59);
                auVar28 = _DAT_0205a980 & ~auVar59;
                if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar28 >> 0x7f,0) == '\0') &&
                      (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar28 >> 0xbf,0) == '\0') &&
                    (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar28[0x1f]) {
                  auVar29 = ZEXT3264(auVar59 ^ _DAT_0205a980);
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_2740->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar39 = ZEXT1632(auVar39._0_16_);
                    auVar44 = ZEXT1632(auVar44._0_16_);
                    (*p_Var7)(&local_2700);
                  }
                  auVar65._8_8_ = uStack_25f8;
                  auVar65._0_8_ = local_2600;
                  auVar65._16_8_ = uStack_25f0;
                  auVar65._24_8_ = uStack_25e8;
                  auVar59 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar65);
                  auVar28 = vpcmpeqd_avx2(auVar44,auVar44);
                  auVar29 = ZEXT3264(auVar59 ^ auVar28);
                  auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
                  auVar28 = auVar28 & ~auVar59;
                  if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar28 >> 0x7f,0) != '\0') ||
                        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar28 >> 0xbf,0) != '\0') ||
                      (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar28[0x1f] < '\0') {
                    auVar59 = auVar59 ^ auVar39;
                    auVar28 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])local_2700.hit);
                    *(undefined1 (*) [32])(local_2700.ray + 0x180) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0x20));
                    *(undefined1 (*) [32])(local_2700.ray + 0x1a0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0x40));
                    *(undefined1 (*) [32])(local_2700.ray + 0x1c0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0x60));
                    *(undefined1 (*) [32])(local_2700.ray + 0x1e0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0x80));
                    *(undefined1 (*) [32])(local_2700.ray + 0x200) = auVar28;
                    auVar28 = vpmaskmovd_avx2(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_2700.ray + 0x220) = auVar28;
                    auVar28 = vpmaskmovd_avx2(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_2700.ray + 0x240) = auVar28;
                    auVar28 = vpmaskmovd_avx2(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_2700.ray + 0x260) = auVar28;
                    auVar28 = vpmaskmovd_avx2(auVar59,*(undefined1 (*) [32])(local_2700.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_2700.ray + 0x280) = auVar28;
                  }
                }
                auVar28 = auVar29._0_32_;
                if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar28 >> 0x7f,0) == '\0') &&
                      (auVar29 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar28 >> 0xbf,0) == '\0') &&
                    (auVar29 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar29[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                }
                *(undefined4 *)(local_2760 + local_2738 * 4) = 0;
                uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar27._4_4_ = uVar12;
                auVar27._0_4_ = uVar12;
                auVar27._8_4_ = uVar12;
                auVar27._12_4_ = uVar12;
                auVar29 = ZEXT1664(local_25e0);
                auVar30 = vcmpps_avx(local_25e0,auVar27,2);
                local_2760 = vandps_avx(auVar30,local_2760);
                auVar78 = ZEXT3264(local_25c0);
                uVar22 = local_2738;
                pSVar14 = local_2748;
                uVar19 = local_2730;
                uVar21 = local_2728;
              }
              if ((((local_2760 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2760 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2760 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2760[0xf]) break;
              auVar35._8_4_ = 0x7f800000;
              auVar35._0_8_ = 0x7f8000007f800000;
              auVar35._12_4_ = 0x7f800000;
              auVar30 = vblendvps_avx(auVar35,auVar29._0_16_,local_2760);
              auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
              auVar36 = vminps_avx(auVar36,auVar30);
              auVar41 = vshufpd_avx(auVar36,auVar36,1);
              auVar36 = vminps_avx(auVar41,auVar36);
              auVar36 = vcmpps_avx(auVar30,auVar36,0);
              auVar41 = local_2760 & auVar36;
              auVar30 = local_2760;
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                auVar30 = vandps_avx(auVar36,local_2760);
              }
              uVar12 = vmovmskps_avx(auVar30);
              local_2738 = 0;
              for (uVar22 = CONCAT44((int)(uVar22 >> 0x20),uVar12); (uVar22 & 1) == 0;
                  uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                local_2738 = local_2738 + 1;
              }
            } while( true );
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != local_2718);
    }
    uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar29 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412
                                                  (uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12))))
                                                  ))));
    auVar51 = ZEXT3264(local_24e0);
    auVar53 = ZEXT3264(local_2500);
    auVar55 = ZEXT3264(local_2520);
    auVar60 = ZEXT3264(local_2540);
    auVar66 = ZEXT3264(local_2560);
    auVar69 = ZEXT3264(local_2580);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }